

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

_Bool m68k_cpu_tlb_fill_m68k
                (CPUState *cs,vaddr address,int size,MMUAccessType qemu_access_type,int mmu_idx,
                _Bool probe,uintptr_t retaddr)

{
  target_ulong_conflict local_58;
  int local_54;
  target_ulong_conflict page_size;
  int ret;
  int access_type;
  int prot;
  hwaddr physical;
  CPUM68KState_conflict *env;
  M68kCPU *cpu;
  MMUAccessType MStack_28;
  _Bool probe_local;
  int mmu_idx_local;
  MMUAccessType qemu_access_type_local;
  int size_local;
  vaddr address_local;
  CPUState *cs_local;
  
  physical = (hwaddr)(cs[1].tb_jmp_cache + 0x8f);
  env = (CPUM68KState_conflict *)cs;
  cpu._3_1_ = probe;
  cpu._4_4_ = mmu_idx;
  MStack_28 = qemu_access_type;
  mmu_idx_local = size;
  _qemu_access_type_local = address;
  address_local = (vaddr)cs;
  if (((ulong)cs[1].tb_jmp_cache[0xb8] & 0x8000) == 0) {
    tlb_set_page_m68k(cs,(uint)address & 0xfffff000,address & 0xfffff000,7,mmu_idx,0x1000);
    cs_local._7_1_ = true;
  }
  else {
    if (qemu_access_type == MMU_INST_FETCH) {
      page_size = 0x10;
    }
    else {
      page_size = 0x20;
      if (qemu_access_type == MMU_DATA_STORE) {
        page_size = 0x22;
      }
    }
    if (mmu_idx != 1) {
      page_size = page_size | 1;
    }
    local_54 = get_physical_address
                         ((CPUM68KState_conflict *)(cs[1].tb_jmp_cache + 0x8f),
                          (hwaddr *)&access_type,&ret,(uint)address,page_size,&local_58);
    if (local_54 == 0) {
      _qemu_access_type_local = _qemu_access_type_local & 0xfffff000;
      _access_type = (_qemu_access_type_local & local_58 - 1) + _access_type;
      tlb_set_page_m68k((CPUState *)address_local,(target_ulong_conflict)_qemu_access_type_local,
                        _access_type,ret,cpu._4_4_,0x1000);
      cs_local._7_1_ = true;
    }
    else {
      if ((cpu._3_1_ & 1) == 0) {
        *(undefined4 *)(physical + 0x144) = 0x400;
        if (mmu_idx_local == 1) {
          *(uint *)(physical + 0x144) = *(uint *)(physical + 0x144) | 0x20;
        }
        else if (mmu_idx_local == 2) {
          *(uint *)(physical + 0x144) = *(uint *)(physical + 0x144) | 0x40;
        }
        else if (mmu_idx_local == 4) {
          *(undefined4 *)(physical + 0x144) = *(undefined4 *)(physical + 0x144);
        }
        if ((page_size & 1) != 0) {
          *(uint *)(physical + 0x144) = *(uint *)(physical + 0x144) | 4;
        }
        if ((page_size & 0x10) == 0) {
          *(uint *)(physical + 0x144) = *(uint *)(physical + 0x144) | 1;
        }
        else {
          *(uint *)(physical + 0x144) = *(uint *)(physical + 0x144) | 2;
        }
        if ((page_size & 2) == 0) {
          *(uint *)(physical + 0x144) = *(uint *)(physical + 0x144) | 0x100;
        }
        *(undefined4 *)(address_local + 0x81a0) = 2;
        *(int *)(physical + 0x140) = (int)_qemu_access_type_local;
        cpu_loop_exit_restore_m68k((CPUState *)address_local,retaddr);
      }
      cs_local._7_1_ = false;
    }
  }
  return cs_local._7_1_;
}

Assistant:

bool m68k_cpu_tlb_fill(CPUState *cs, vaddr address, int size,
                       MMUAccessType qemu_access_type, int mmu_idx,
                       bool probe, uintptr_t retaddr)
{
    M68kCPU *cpu = M68K_CPU(cs);
    CPUM68KState *env = &cpu->env;

    hwaddr physical;
    int prot;
    int access_type;
    int ret;
    target_ulong page_size;

    if ((env->mmu.tcr & M68K_TCR_ENABLED) == 0) {
        /* MMU disabled */
        tlb_set_page(cs, address & TARGET_PAGE_MASK,
                     address & TARGET_PAGE_MASK,
                     PAGE_READ | PAGE_WRITE | PAGE_EXEC,
                     mmu_idx, TARGET_PAGE_SIZE);
        return true;
    }

    if (qemu_access_type == MMU_INST_FETCH) {
        access_type = ACCESS_CODE;
    } else {
        access_type = ACCESS_DATA;
        if (qemu_access_type == MMU_DATA_STORE) {
            access_type |= ACCESS_STORE;
        }
    }
    if (mmu_idx != MMU_USER_IDX) {
        access_type |= ACCESS_SUPER;
    }

    ret = get_physical_address(&cpu->env, &physical, &prot,
                               address, access_type, &page_size);
    if (likely(ret == 0)) {
        address &= TARGET_PAGE_MASK;
        physical += address & (page_size - 1);
        tlb_set_page(cs, address, physical,
                     prot, mmu_idx, TARGET_PAGE_SIZE);
        return true;
    }

    if (probe) {
        return false;
    }

    /* page fault */
    env->mmu.ssw = M68K_ATC_040;
    switch (size) {
    case 1:
        env->mmu.ssw |= M68K_BA_SIZE_BYTE;
        break;
    case 2:
        env->mmu.ssw |= M68K_BA_SIZE_WORD;
        break;
    case 4:
        env->mmu.ssw |= M68K_BA_SIZE_LONG;
        break;
    }
    if (access_type & ACCESS_SUPER) {
        env->mmu.ssw |= M68K_TM_040_SUPER;
    }
    if (access_type & ACCESS_CODE) {
        env->mmu.ssw |= M68K_TM_040_CODE;
    } else {
        env->mmu.ssw |= M68K_TM_040_DATA;
    }
    if (!(access_type & ACCESS_STORE)) {
        env->mmu.ssw |= M68K_RW_040;
    }

    cs->exception_index = EXCP_ACCESS;
    env->mmu.ar = address;
    cpu_loop_exit_restore(cs, retaddr);
}